

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O2

double __thiscall
ChebTools::ChebyshevCollection::integrate(ChebyshevCollection *this,double xmin,double xmax)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_98;
  double local_78;
  ChebyshevExpansion I;
  
  iVar2 = get_index(this,xmin);
  iVar3 = get_index(this,xmax);
  if (iVar3 == iVar2) {
    ChebyshevExpansion::integrate
              (&I,(this->m_exps).
                  super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar2,1);
    local_98 = ChebyshevExpansion::y_Clenshaw(&I,xmax);
    dVar6 = ChebyshevExpansion::y_Clenshaw(&I,xmin);
    local_98 = local_98 - dVar6;
  }
  else {
    lVar4 = (long)iVar2;
    local_78 = 0.0;
    lVar5 = lVar4;
    lVar1 = lVar4 * 0x40;
    while( true ) {
      lVar5 = lVar5 + 1;
      if (iVar3 <= lVar5) break;
      ChebyshevExpansion::integrate
                (&I,(ChebyshevExpansion *)
                    ((long)&(this->m_exps).
                            super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].m_c.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + lVar1),
                 1);
      dVar6 = ChebyshevExpansion::y_Clenshaw(&I,I.m_xmax);
      dVar7 = ChebyshevExpansion::y_Clenshaw(&I,I.m_xmin);
      local_78 = local_78 + (dVar6 - dVar7);
      ChebyshevExpansion::~ChebyshevExpansion(&I);
      lVar1 = lVar1 + 0x40;
    }
    ChebyshevExpansion::integrate
              (&I,(this->m_exps).
                  super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar4,1);
    dVar6 = ChebyshevExpansion::y_Clenshaw(&I,I.m_xmax);
    dVar7 = ChebyshevExpansion::y_Clenshaw(&I,xmin);
    ChebyshevExpansion::~ChebyshevExpansion(&I);
    ChebyshevExpansion::integrate
              (&I,(this->m_exps).
                  super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar3,1);
    dVar8 = ChebyshevExpansion::y_Clenshaw(&I,xmax);
    dVar9 = ChebyshevExpansion::y_Clenshaw(&I,I.m_xmin);
    local_98 = (dVar8 - dVar9) + local_78 + (dVar6 - dVar7);
  }
  ChebyshevExpansion::~ChebyshevExpansion(&I);
  return local_98;
}

Assistant:

auto integrate(double xmin, double xmax) const {
            // Bisection to find the expansions we need
            auto imin = get_index(xmin), imax = get_index(xmax);
            if (imax == imin) {
                auto I = m_exps[imin].integrate(1);
                return I.y(xmax) - I.y(xmin);
            }
            else {
                // All the intervals between the two ones containing the limits (non-inclusive)
                // contribute the full amount, integrating from xmin to xmax
                double s = 0;
                for (auto i = imin + 1; i < imax; ++i) {
                    auto I = m_exps[i].integrate(1);
                    s += I.y(I.xmax()) - I.y(I.xmin());
                }
                // Bottom is from value to right edge
                {
                    auto I = m_exps[imin].integrate(1);
                    s += I.y(I.xmax()) - I.y(xmin);
                }
                // Top is from value to left edge
                {
                    auto I = m_exps[imax].integrate(1);
                    s += I.y(xmax) - I.y(I.xmin());
                }
                return s;
            }
        }